

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inlined_vector.h
# Opt level: O0

reference __thiscall
absl::
InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>
::GrowAndEmplaceBack<(anonymous_namespace)::CrossingGraphEdge>
          (InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>
           *this,CrossingGraphEdge *args)

{
  Allocation new_allocation_00;
  size_type sVar1;
  size_type sVar2;
  allocator_type *a;
  pointer pCVar3;
  reference pCVar4;
  move_iterator<(anonymous_namespace)::CrossingGraphEdge_*> src;
  move_iterator<(anonymous_namespace)::CrossingGraphEdge_*> src_last;
  reference new_element;
  Allocation new_allocation;
  size_type s;
  CrossingGraphEdge *args_local;
  InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>
  *this_local;
  
  sVar1 = size(this);
  sVar2 = capacity(this);
  if (sVar1 == sVar2) {
    new_allocation.buffer_ = (pointer)size(this);
    a = allocator(this);
    sVar1 = capacity(this);
    Allocation::Allocation((Allocation *)&new_element,a,sVar1 << 1);
    pCVar3 = Allocation::buffer((Allocation *)&new_element);
    pCVar4 = Construct<(anonymous_namespace)::CrossingGraphEdge>
                       (this,pCVar3 + (long)new_allocation.buffer_,args);
    pCVar3 = data(this);
    src = std::make_move_iterator<(anonymous_namespace)::CrossingGraphEdge*>(pCVar3);
    pCVar3 = data(this);
    src_last = std::make_move_iterator<(anonymous_namespace)::CrossingGraphEdge*>
                         (pCVar3 + (long)new_allocation.buffer_);
    pCVar3 = Allocation::buffer((Allocation *)&new_element);
    InlinedVector<(anonymous_namespace)::CrossingGraphEdge,2ul,std::allocator<(anonymous_namespace)::CrossingGraphEdge>>
    ::UninitializedCopy<std::move_iterator<(anonymous_namespace)::CrossingGraphEdge*>>
              ((InlinedVector<(anonymous_namespace)::CrossingGraphEdge,2ul,std::allocator<(anonymous_namespace)::CrossingGraphEdge>>
                *)this,src,src_last,pCVar3);
    new_allocation_00.buffer_ = (pointer)new_allocation.capacity_;
    new_allocation_00.capacity_ = (size_type)new_element;
    ResetAllocation(this,new_allocation_00,(size_type)((long)&(new_allocation.buffer_)->id + 1));
    return pCVar4;
  }
  __assert_fail("size() == capacity()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/third_party/absl/container/inlined_vector.h"
                ,0x327,
                "reference absl::InlinedVector<(anonymous namespace)::CrossingGraphEdge, 2>::GrowAndEmplaceBack(Args &&...) [T = (anonymous namespace)::CrossingGraphEdge, N = 2, A = std::allocator<(anonymous namespace)::CrossingGraphEdge>, Args = <(anonymous namespace)::CrossingGraphEdge>]"
               );
}

Assistant:

reference GrowAndEmplaceBack(Args&&... args) {
    assert(size() == capacity());
    const size_type s = size();

    Allocation new_allocation(allocator(), 2 * capacity());

    reference new_element =
        Construct(new_allocation.buffer() + s, std::forward<Args>(args)...);
    UninitializedCopy(std::make_move_iterator(data()),
                      std::make_move_iterator(data() + s),
                      new_allocation.buffer());

    ResetAllocation(new_allocation, s + 1);

    return new_element;
  }